

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall Inject::bind_to_self::test_method(bind_to_self *this)

{
  int iVar1;
  impl1 *piVar2;
  undefined4 extraout_var;
  component<Inject::impl1> b1;
  undefined8 local_f8;
  injected<Inject::impl1> p;
  char *local_e0;
  char *local_d8;
  undefined **local_d0;
  undefined1 local_c8;
  undefined8 *local_c0;
  char *local_b8;
  unique_id local_b0;
  provides<Inject::impl1> b2;
  char *local_90;
  char *local_88;
  context<0> c;
  
  inject::context<0>::component<Inject::impl1>::component(&b1);
  inject::context<0>::component<Inject::impl1>::provides<Inject::impl1>::provides(&b2);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_0015fda8;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::impl1,Inject::impl1,(inject::component_scope)0>
            (inject::context<0>::head()::_head);
  inject::context<0>::injected<Inject::impl1>::injected(&p);
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_88 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x18a);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_0015fea8;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_d8 = "";
  piVar2 = inject::context<0>::injected<Inject::impl1>::operator->(&p);
  iVar1 = (**(piVar2->super_service)._vptr_service)(piVar2);
  local_f8 = CONCAT44(extraout_var,iVar1);
  local_b0 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_d0,&local_e0,0x18a,1,2,&local_f8,"p->id()",&local_b0,"id_of<impl1>::id()");
  boost::detail::shared_count::~shared_count(&p._ptr.pn);
  inject::context<0>::~context(&c);
  inject::context<0>::component<Inject::impl1>::~component(&b1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bind_to_self)
{
    context<>::component<impl1> b1;
    context<>::component<impl1>::provides<impl1> b2;

    context<> c;
    
    c.bind<impl1>();
    context<>::injected<impl1> p;
    BOOST_CHECK_EQUAL(p->id(), id_of<impl1>::id());
}